

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-fixed-contact-dynamical-system.cpp
# Opt level: O2

Quaternion * __thiscall
stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::computeQuaternion_
          (Quaternion *__return_storage_ptr__,IMUFixedContactDynamicalSystem *this,Vector3 *x)

{
  bool bVar1;
  AngleAxis local_40;
  
  bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,2,3,1>>::operator!=
                    ((MatrixBase<Eigen::Matrix<double,3,1,2,3,1>> *)&this->orientationVector_,
                     (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)x);
  if (bVar1) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,2,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
              (&this->orientationVector_,x);
    kine::rotationVectorToAngleAxis(&local_40,x);
    Eigen::QuaternionBase<Eigen::Quaternion<double,_2>_>::operator=
              ((QuaternionBase<Eigen::Quaternion<double,_2>_> *)&this->quaternion_,&local_40);
  }
  Eigen::internal::call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,2,4,1>>
            (&__return_storage_ptr__->m_coeffs,&(this->quaternion_).m_coeffs);
  return __return_storage_ptr__;
}

Assistant:

Quaternion IMUFixedContactDynamicalSystem::computeQuaternion_(const Vector3 & x)
{
  if(orientationVector_ != x)
  {
    orientationVector_ = x;
    quaternion_ = kine::rotationVectorToAngleAxis(x);
  }

  return quaternion_;
}